

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-trait.c
# Opt level: O3

void borg_trait_free(void)

{
  mem_free(borg.has);
  borg.has = (int *)0x0;
  mem_free(borg.trait);
  borg.trait = (int *)0x0;
  mem_free(borg.activation);
  borg.activation = (int *)0x0;
  return;
}

Assistant:

void borg_trait_free(void)
{
    mem_free(borg.has);
    borg.has = NULL;
    mem_free(borg.trait);
    borg.trait = NULL;
    mem_free(borg.activation);
    borg.activation = NULL;
}